

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O1

void __thiscall psy::C::DeclarationBinderTester::case0304(DeclarationBinderTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Decl *pDVar3;
  Ty *pTVar4;
  Expectation *pEVar5;
  socklen_t __len;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  long *local_500 [2];
  long local_4f0 [2];
  string local_4e0;
  Expectation local_4c0;
  Expectation local_408;
  Decl local_350;
  Decl local_288;
  Decl local_1c0;
  Decl local_f8;
  
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_500,"void x ( y ( * z ) ( w ) ) ;","");
  Expectation::Expectation(&local_4c0);
  Decl::Decl(&local_f8);
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"x","");
  pDVar3 = Decl::Function(&local_f8,&local_520,File);
  pDVar3 = Ty::Void(&pDVar3->ty_,None);
  pDVar3 = Ty::Derived(&pDVar3->ty_,Function,None,None);
  pTVar4 = Ty::addParam(&pDVar3->ty_);
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"y","");
  pDVar3 = Ty::Typedef(pTVar4,&local_540,None);
  pTVar4 = Ty::atParam(&pDVar3->ty_);
  pDVar3 = Ty::Derived(pTVar4,Function,None,None);
  pTVar4 = Ty::atParam(&pDVar3->ty_);
  pTVar4 = Ty::addParam(pTVar4);
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"w","");
  pDVar3 = Ty::Typedef(pTVar4,&local_560,None);
  pTVar4 = Ty::atParam(&pDVar3->ty_);
  pDVar3 = Ty::Derived(pTVar4,Pointer,None,None);
  local_350.ident_._M_dataplus._M_p = (pointer)&local_350.ident_.field_2;
  pcVar2 = (pDVar3->ident_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_350,pcVar2,pcVar2 + (pDVar3->ident_)._M_string_length);
  local_350.ns_ = pDVar3->ns_;
  local_350.declK_ = pDVar3->declK_;
  local_350.tyDeclK_ = pDVar3->tyDeclK_;
  local_350.symK_ = pDVar3->symK_;
  local_350.scopeK_ = pDVar3->scopeK_;
  Ty::Ty(&local_350.ty_,&pDVar3->ty_);
  pEVar5 = Expectation::declaration(&local_4c0,&local_350);
  Decl::Decl(&local_1c0);
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"z","");
  pDVar3 = Decl::Object(&local_1c0,&local_580,ParameterDeclaration,FunctionPrototype);
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"y","");
  pDVar3 = Ty::Typedef(&pDVar3->ty_,&local_4e0,None);
  pDVar3 = Ty::Derived(&pDVar3->ty_,Function,None,None);
  pTVar4 = Ty::addParam(&pDVar3->ty_);
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"w","");
  pDVar3 = Ty::Typedef(pTVar4,&local_5a0,None);
  __len = 0;
  pDVar3 = Ty::Derived(&pDVar3->ty_,Pointer,None,None);
  paVar1 = &local_288.ident_.field_2;
  pcVar2 = (pDVar3->ident_)._M_dataplus._M_p;
  local_288.ident_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar2,pcVar2 + (pDVar3->ident_)._M_string_length);
  local_288.ns_ = pDVar3->ns_;
  local_288.declK_ = pDVar3->declK_;
  local_288.tyDeclK_ = pDVar3->tyDeclK_;
  local_288.symK_ = pDVar3->symK_;
  local_288.scopeK_ = pDVar3->scopeK_;
  Ty::Ty(&local_288.ty_,&pDVar3->ty_);
  pEVar5 = Expectation::declaration(pEVar5,&local_288);
  Expectation::Expectation(&local_408,pEVar5);
  bind(this,(int)local_500,(sockaddr *)&local_408,__len);
  if (local_408.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_408.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_408.declarations_);
  if (local_408.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.ambiguityText_._M_dataplus._M_p != &local_408.ambiguityText_.field_2) {
    operator_delete(local_408.ambiguityText_._M_dataplus._M_p,
                    local_408.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_408.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_408.descriptorsE_);
  Ty::~Ty(&local_288.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.ident_._M_dataplus._M_p != paVar1) {
    operator_delete(local_288.ident_._M_dataplus._M_p,
                    local_288.ident_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_1c0.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.ident_._M_dataplus._M_p != &local_1c0.ident_.field_2) {
    operator_delete(local_1c0.ident_._M_dataplus._M_p,
                    local_1c0.ident_.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_350.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.ident_._M_dataplus._M_p != &local_350.ident_.field_2) {
    operator_delete(local_350.ident_._M_dataplus._M_p,
                    local_350.ident_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  Ty::~Ty(&local_f8.ty_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.ident_._M_dataplus._M_p != &local_f8.ident_.field_2) {
    operator_delete(local_f8.ident_._M_dataplus._M_p,
                    local_f8.ident_.field_2._M_allocated_capacity + 1);
  }
  if (local_4c0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4c0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_4c0.declarations_);
  if (local_4c0.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c0.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4c0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.ambiguityText_._M_dataplus._M_p != &local_4c0.ambiguityText_.field_2) {
    operator_delete(local_4c0.ambiguityText_._M_dataplus._M_p,
                    local_4c0.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c0.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c0.descriptorsE_);
  if (local_500[0] != local_4f0) {
    operator_delete(local_500[0],local_4f0[0] + 1);
  }
  return;
}

Assistant:

void DeclarationBinderTester::case0304()
{
    bind("void x ( y ( * z ) ( w ) ) ;",
         Expectation()
         .declaration(Decl()
                  .Function("x", ScopeKind::File)
                  .ty_.Void()
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Typedef("y")
                  .ty_.atParam().Derived(TypeKind::Function)
                  .ty_.atParam().addParam().Typedef("w")
                  .ty_.atParam().Derived(TypeKind::Pointer))
         .declaration(Decl()
                  .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Typedef("y")
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Typedef("w")
                  .ty_.Derived(TypeKind::Pointer)));
}